

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# matrix.c
# Opt level: O0

void M_SetName(Matrix *M,char *Name)

{
  LASErrIdType LVar1;
  size_t sVar2;
  char *pcVar3;
  char *Name_local;
  Matrix *M_local;
  
  LVar1 = LASResult();
  if (LVar1 == LASOK) {
    free(M->Name);
    sVar2 = strlen(Name);
    pcVar3 = (char *)malloc(sVar2 + 1);
    M->Name = pcVar3;
    if (M->Name == (char *)0x0) {
      LASError(LASMemAllocErr,"M_SetName",Name,(char *)0x0,(char *)0x0);
    }
    else {
      strcpy(M->Name,Name);
    }
  }
  return;
}

Assistant:

void M_SetName(Matrix *M, char *Name)
/* (re)set name of the matrix M */
{
    if (LASResult() == LASOK) {
        free(M->Name);
        M->Name = (char *)malloc((strlen(Name) + 1) * sizeof(char));
        if (M->Name != NULL)
            strcpy(M->Name, Name);
        else
            LASError(LASMemAllocErr, "M_SetName", Name, NULL, NULL);
    }
}